

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O2

RegSlot __thiscall FuncInfo::NextConstRegister(FuncInfo *this)

{
  RegSlot RVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->firstTmpReg != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0xe8,"(this->firstTmpReg == Js::Constants::NoRegister)",
                       "Shouldn\'t assign var register after we start allocating temp reg");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  RVar1 = this->constRegsCount;
  UInt32Math::Inc(&this->constRegsCount);
  return -RVar1 - 2;
}

Assistant:

Js::RegSlot NextConstRegister()
    {
        AssertMsg(this->firstTmpReg == Js::Constants::NoRegister, "Shouldn't assign var register after we start allocating temp reg");
        Js::RegSlot reg = constRegsCount;
        UInt32Math::Inc(constRegsCount);
        return REGSLOT_TO_CONSTREG(reg);
    }